

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Matrix4f.cpp
# Opt level: O0

Vector4f __thiscall Matrix4f::getCol(Matrix4f *this,int j)

{
  float fx;
  float fy;
  int iVar1;
  int in_EDX;
  long in_RSI;
  Vector4f *in_RDI;
  ulong uVar2;
  ulong uVar3;
  Vector4f VVar4;
  int colStart;
  
  iVar1 = in_EDX * 4;
  fx = *(float *)(in_RSI + (long)iVar1 * 4);
  uVar2 = (ulong)(uint)fx;
  fy = *(float *)(in_RSI + (long)(iVar1 + 1) * 4);
  uVar3 = (ulong)(uint)fy;
  Vector4f::Vector4f(in_RDI,fx,fy,*(float *)(in_RSI + (long)(iVar1 + 2) * 4),
                     *(float *)(in_RSI + (long)(iVar1 + 3) * 4));
  VVar4.m_elements[2] = (float)(int)uVar3;
  VVar4.m_elements[3] = (float)(int)(uVar3 >> 0x20);
  VVar4.m_elements[0] = (float)(int)uVar2;
  VVar4.m_elements[1] = (float)(int)(uVar2 >> 0x20);
  return (Vector4f)VVar4.m_elements;
}

Assistant:

Vector4f Matrix4f::getCol( int j ) const
{
	int colStart = 4 * j;

	return Vector4f
	(
		m_elements[ colStart ],
		m_elements[ colStart + 1 ],
		m_elements[ colStart + 2 ],
		m_elements[ colStart + 3 ]
	);
}